

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * CLI::detail::trim_copy(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var2;
  size_t __n;
  long *plVar3;
  long lVar4;
  string s;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  it;
  long *local_50;
  long local_48;
  long local_40 [2];
  undefined1 *local_30;
  long *local_28;
  undefined1 *local_20;
  
  pcVar1 = (str->_M_dataplus)._M_p;
  local_50 = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + str->_M_string_length);
  local_20 = (undefined1 *)(local_48 + (long)local_50);
  local_28 = local_50;
  ::std::
  __find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::rtrim(std::__cxx11::string&)::_lambda(char)_1_>>
            (&local_30);
  local_48 = (long)local_30 - (long)local_50;
  *local_30 = 0;
  _Var2 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_pred<CLI::detail::ltrim(std::__cxx11::string&)::_lambda(char)_1_>>
                    (local_50,(undefined1 *)(local_48 + (long)local_50));
  if ((char *)((long)local_50 + local_48) == _Var2._M_current) {
    local_48 = 0;
    plVar3 = local_50;
  }
  else {
    lVar4 = (long)_Var2._M_current - (long)local_50;
    if ((local_48 != lVar4 && lVar4 != 0) && (__n = local_48 - lVar4, __n != 0)) {
      if (__n == 1) {
        *(undefined1 *)local_50 = *(undefined1 *)((long)local_50 + lVar4);
      }
      else {
        memmove(local_50,(undefined1 *)((long)local_50 + lVar4),__n);
      }
    }
    local_48 = local_48 - lVar4;
    plVar3 = (long *)(local_48 + (long)local_50);
  }
  *(undefined1 *)plVar3 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_50,(undefined1 *)(local_48 + (long)local_50));
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string trim_copy(const std::string &str) {
    std::string s = str;
    return trim(s);
}